

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O2

optional<wasm::TopologicalOrdersImpl<std::monostate>::Selector> __thiscall
wasm::TopologicalOrdersImpl<std::monostate>::Selector::advance
          (Selector *this,TopologicalOrdersImpl<std::monostate> *ctx)

{
  pointer puVar1;
  uint uVar2;
  Index IVar3;
  pointer puVar4;
  pointer pvVar5;
  uint *puVar6;
  int iVar7;
  undefined4 extraout_var;
  fd_set *__writefds;
  Index i;
  uint uVar9;
  uint extraout_EDX;
  fd_set *__readfds;
  ulong uVar10;
  Index IVar11;
  uint *puVar12;
  optional<wasm::TopologicalOrdersImpl<std::monostate>::Selector> oVar13;
  pointer puVar8;
  
  if (this->count != 0) {
    puVar8 = (ctx->buf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = puVar8[this->start];
    puVar4 = (ctx->indegrees).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pvVar5 = (ctx->graph->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar6 = *(pointer *)
              ((long)&pvVar5[uVar2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl + 8);
    for (puVar12 = *(uint **)&pvVar5[uVar2].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl; puVar12 != puVar6; puVar12 = puVar12 + 1) {
      puVar1 = puVar4 + *puVar12;
      *puVar1 = *puVar1 + 1;
    }
    IVar11 = this->count;
    IVar3 = this->index;
    if (IVar3 == IVar11 - 1) {
      uVar9 = 1;
      while( true ) {
        IVar3 = this->start;
        if (IVar11 <= uVar9) break;
        puVar8[(IVar3 + uVar9) - 1] = puVar8[uVar9 + IVar3];
        uVar9 = uVar9 + 1;
        IVar11 = this->count;
      }
      puVar8[(IVar11 + IVar3) - 1] = uVar2;
      uVar10 = 0;
    }
    else {
      __writefds = (fd_set *)(ulong)this->start;
      this->index = IVar3 + 1;
      __readfds = (fd_set *)(ulong)(IVar3 + this->start + 1);
      uVar2 = puVar8[(long)__writefds];
      uVar9 = puVar8[(long)__readfds];
      puVar8[(long)__writefds] = uVar9;
      puVar8[(long)__readfds] = uVar2;
      iVar7 = select(this,(int)ctx,__readfds,__writefds,(fd_set *)(ulong)uVar2,
                     (timeval *)(ulong)uVar9);
      puVar8 = (pointer)CONCAT44(extraout_var,iVar7);
      uVar10 = (ulong)extraout_EDX | 0x100000000;
    }
    oVar13.super__Optional_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector>.
    _8_8_ = uVar10;
    oVar13.super__Optional_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector>.
    _M_payload._0_8_ = puVar8;
    return (optional<wasm::TopologicalOrdersImpl<std::monostate>::Selector>)
           oVar13.
           super__Optional_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_true,_true>.
           _M_payload.
           super__Optional_payload_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector>;
  }
  __assert_fail("count >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                ,0xfb,
                "std::optional<Selector> wasm::TopologicalOrdersImpl<>::Selector::advance(TopologicalOrdersImpl<F> &) [F = std::monostate]"
               );
}

Assistant:

std::optional<Selector> advance(TopologicalOrdersImpl& ctx) {
      assert(count >= 1);
      // Undo the current selection. Backtrack by incrementing the in-degree for
      // each child of the vertex we are unselecting. No need to remove the
      // newly unavailable children from the buffer; they will be overwritten
      // with valid selections.
      auto unselected = ctx.buf[start];
      for (auto child : ctx.graph[unselected]) {
        ++ctx.indegrees[child];
      }
      if (index == count - 1) {
        // We are wrapping back to the original configuration. The current
        // selection element needs to go back on the end and everything else
        // needs to be shifted back to its original location. This ensures that
        // we leave everything how we found it so the previous selector can make
        // its next selection without observing anything having changed in the
        // meantime.
        for (Index i = 1; i < count; ++i) {
          ctx.buf[start + i - 1] = ctx.buf[start + i];
        }
        ctx.buf[start + count - 1] = unselected;
        return std::nullopt;
      }
      // Otherwise, just swap the next selection into the first position and
      // finalize the selection.
      std::swap(ctx.buf[start], ctx.buf[start + ++index]);
      return select(ctx);
    }